

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogl_draw.c
# Opt level: O2

void ogl_draw_pixel(ALLEGRO_DISPLAY *d,float x,float y,ALLEGRO_COLOR *color)

{
  _Bool _Var1;
  ALLEGRO_BITMAP *pAVar2;
  int stride;
  void *in_R8;
  ALLEGRO_BITMAP *bitmap;
  GLfloat vert [2];
  undefined8 local_28;
  undefined8 uStack_20;
  
  pAVar2 = al_get_target_bitmap();
  bitmap = pAVar2->parent;
  if (pAVar2->parent == (ALLEGRO_BITMAP *)0x0) {
    bitmap = pAVar2;
  }
  if (((*(char *)((long)bitmap->extra + 0x38) != '\0') || (d->ogl_extras->opengl_target == bitmap))
     && (bitmap->locked == false)) {
    _Var1 = _al_opengl_set_blender(d);
    if (_Var1) {
      local_28._0_4_ = color->r;
      local_28._4_4_ = color->g;
      uStack_20._0_4_ = color->b;
      uStack_20._4_4_ = color->a;
      stride = (int)vert;
      vert[0] = x;
      vert[1] = y;
      vert_ptr_on(d,2,8,stride,in_R8);
      color_ptr_on(d,0x10,(GLint)&local_28,stride,in_R8);
      _Var1 = _al_opengl_set_blender(d);
      if (_Var1) {
        glDrawArrays(0,0,1);
        vert_ptr_off(d);
        color_ptr_off(d);
      }
      return;
    }
  }
  _al_draw_pixel_memory(bitmap,x,y,color);
  return;
}

Assistant:

static void ogl_draw_pixel(ALLEGRO_DISPLAY *d, float x, float y,
   ALLEGRO_COLOR *color)
{
   ALLEGRO_BITMAP *target = al_get_target_bitmap();
   ALLEGRO_BITMAP_EXTRA_OPENGL *ogl_target;
   GLfloat vert[2];
   GLfloat color_array[4];

   /* For sub-bitmaps */
   if (target->parent) {
      target = target->parent;
   }

   ogl_target = target->extra;

   if ((!ogl_target->is_backbuffer &&
      d->ogl_extras->opengl_target != target) ||
      target->locked || !_al_opengl_set_blender(d))  {
      _al_draw_pixel_memory(target, x, y, color);
      return;
   }

   vert[0] = x;
   vert[1] = y;

   color_array[0] = color->r;
   color_array[1] = color->g;
   color_array[2] = color->b;
   color_array[3] = color->a;

   vert_ptr_on(d, 2, GL_FLOAT, 2*sizeof(float), vert);
   color_ptr_on(d, 4, GL_FLOAT, 4*sizeof(float), color_array);

   // Should this be here if it's in the if above?
   if (!_al_opengl_set_blender(d)) {
      return;
   }

   glDrawArrays(GL_POINTS, 0, 1);

   vert_ptr_off(d);
   color_ptr_off(d);
}